

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O1

void objShiftPtrs(void *obj,ptrdiff_t diff)

{
  long *plVar1;
  void *obj_00;
  void *pvVar2;
  ulong uVar3;
  
  if (*(long *)((long)obj + 0x10) == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    do {
      obj_00 = *(void **)((long)obj + uVar3 * 8 + 0x18);
      pvVar2 = (void *)((long)obj_00 + diff);
      if ((obj <= pvVar2) && (pvVar2 < (void *)(*obj + (long)obj))) {
        objShiftPtrs(obj_00,diff);
        plVar1 = (long *)((long)obj + uVar3 * 8 + 0x18);
        *plVar1 = *plVar1 + diff;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < *(ulong *)((long)obj + 0x10));
  }
  for (; uVar3 < *(ulong *)((long)obj + 8); uVar3 = uVar3 + 1) {
    pvVar2 = (void *)(*(long *)((long)obj + uVar3 * 8 + 0x18) + diff);
    if ((obj <= pvVar2) && (pvVar2 < (void *)(*obj + (long)obj))) {
      *(void **)((long)obj + uVar3 * 8 + 0x18) = pvVar2;
    }
  }
  return;
}

Assistant:

static void objShiftPtrs(void* obj, ptrdiff_t diff)
{
	size_t i;
	// просмотреть объекты
	for (i = 0; i < objOCount(obj); ++i)
		// вложенный объект?
		if ((octet*)obj <= objPtr(obj, i, octet) + diff && 
			objPtr(obj, i, octet) + diff < objEnd(obj, octet))
		{
			objShiftPtrs(objPtr(obj, i, void), diff);
			objPtr(obj, i, octet) += diff;
		}
	// просмотреть оставшиеся указатели
	for (; i < objPCount(obj); ++i)
		// вложенный указатель?
		if ((octet*)obj <= objPtr(obj, i, octet) + diff && 
			objPtr(obj, i, octet) + diff < objEnd(obj, octet))
			objPtr(obj, i, octet) += diff;
}